

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_queue.cpp
# Opt level: O0

void mpmc_basics<int,4ul>(void)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  byte extraout_AL_01;
  byte extraout_AL_02;
  byte extraout_AL_03;
  byte extraout_AL_04;
  byte extraout_AL_05;
  byte extraout_AL_06;
  byte extraout_AL_07;
  byte extraout_AL_08;
  byte extraout_AL_09;
  byte extraout_AL_10;
  byte extraout_AL_11;
  byte extraout_AL_12;
  _Optional_payload_base<int> rhs;
  Expression_lhs<const_bool> exception_string;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  Expression_lhs<const_unsigned_long> EVar2;
  Expression_lhs<const_std::optional<int>_> EVar3;
  ResultBuilder DOCTEST_RB_13;
  ResultBuilder DOCTEST_RB_12;
  ResultBuilder DOCTEST_RB_11;
  ResultBuilder DOCTEST_RB_10;
  size_t i_3;
  ResultBuilder DOCTEST_RB_9;
  size_t i_2;
  ResultBuilder DOCTEST_RB_8;
  ResultBuilder DOCTEST_RB_7;
  ResultBuilder DOCTEST_RB_6;
  size_t i_1;
  ResultBuilder DOCTEST_RB_5;
  ResultBuilder DOCTEST_RB_4;
  ResultBuilder DOCTEST_RB_3;
  size_t i;
  ResultBuilder DOCTEST_RB_2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  vector<int,_std::allocator<int>_> data;
  size_t N;
  MPMC<int,_4UL> mpmc;
  Result *pRVar4;
  ResultBuilder *in_stack_fffffffffffff188;
  undefined4 in_stack_fffffffffffff190;
  int in_stack_fffffffffffff194;
  undefined4 in_stack_fffffffffffff198;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffff19c;
  size_type in_stack_fffffffffffff1a0;
  Enum EVar6;
  ResultBuilder *in_stack_fffffffffffff1a8;
  MPMC<int,_4UL> *in_stack_fffffffffffff1b8;
  MPMC<int,_4UL> *in_stack_fffffffffffff1c8;
  nullopt_t *in_stack_fffffffffffff208;
  undefined7 in_stack_fffffffffffff210;
  undefined1 in_stack_fffffffffffff217;
  byte bVar7;
  ExpressionDecomposer local_d2c;
  Expression_lhs<const_std::optional<int>_> local_d28;
  int in_stack_fffffffffffff304;
  undefined4 in_stack_fffffffffffff308;
  int in_stack_fffffffffffff30c;
  MPMC<int,_4UL> *in_stack_fffffffffffff310;
  ExpressionDecomposer local_c7c;
  Expression_lhs<const_bool> local_c78;
  ResultBuilder local_c50;
  Expression_lhs<const_std::optional<int>_> local_bd8;
  _Optional_payload_base<int> local_bc4;
  ExpressionDecomposer local_bbc;
  Expression_lhs<const_std::optional<int>_> local_bb8;
  ResultBuilder local_b88;
  undefined1 local_b0e;
  undefined1 local_b0d;
  ExpressionDecomposer local_b0c;
  Expression_lhs<const_bool> local_b08;
  ResultBuilder local_ae0;
  ulong local_a68;
  undefined1 local_a5e;
  undefined1 local_a5d;
  ExpressionDecomposer local_a5c;
  Expression_lhs<const_bool> local_a58;
  ResultBuilder local_a30;
  size_type local_9b8;
  Expression_lhs<const_std::optional<int>_> local_9b0;
  _Optional_payload_base<int> local_99c;
  ExpressionDecomposer local_994;
  Expression_lhs<const_std::optional<int>_> local_990;
  ResultBuilder local_960;
  undefined1 local_8e6;
  undefined1 local_8e5;
  ExpressionDecomposer local_8e4;
  Expression_lhs<const_bool> local_8e0;
  ResultBuilder local_8b8;
  Expression_lhs<const_std::optional<int>_> local_840;
  _Optional_payload_base<int> local_82c;
  ExpressionDecomposer local_824;
  Expression_lhs<const_std::optional<int>_> local_820;
  ResultBuilder local_7f0;
  ulong local_778;
  undefined1 local_76e;
  undefined1 local_76d;
  ExpressionDecomposer local_76c;
  Expression_lhs<const_bool> local_768;
  ResultBuilder local_740;
  undefined1 local_6c6;
  undefined1 local_6c5;
  ExpressionDecomposer local_6c4;
  Expression_lhs<const_bool> local_6c0;
  ResultBuilder local_698;
  undefined1 local_61e;
  undefined1 local_61d;
  ExpressionDecomposer local_61c;
  Expression_lhs<const_bool> local_618;
  ResultBuilder local_5f0;
  ulong local_578;
  Expression_lhs<const_std::optional<int>_> local_570;
  _Optional_payload_base<int> local_55c;
  ExpressionDecomposer local_554;
  Expression_lhs<const_std::optional<int>_> local_550;
  ResultBuilder local_520;
  undefined1 local_4a6;
  undefined1 local_4a5;
  ExpressionDecomposer local_4a4;
  Expression_lhs<const_bool> local_4a0;
  ResultBuilder local_478;
  unsigned_long local_400;
  Enum local_3f8;
  size_t local_3f0;
  ExpressionDecomposer local_3e4;
  unsigned_long local_3e0;
  Enum local_3d8;
  ResultBuilder local_3b0;
  undefined4 local_324;
  vector<int,_std::allocator<int>_> local_320;
  ulong local_308;
  MPMC<int,_4UL> local_300;
  
  tf::MPMC<int,_4UL>::MPMC(in_stack_fffffffffffff1c8);
  local_308 = 0x10;
  local_324 = 0xffffffff;
  std::allocator<int>::allocator((allocator<int> *)0x177d1b);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff1a8,
             in_stack_fffffffffffff1a0,
             (value_type_conflict1 *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
             (allocator_type *)CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  std::allocator<int>::~allocator((allocator<int> *)0x177d4f);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff1a8,(Enum)(in_stack_fffffffffffff1a0 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
             in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
             (char *)in_stack_fffffffffffff1b8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_3e4,DT_REQUIRE);
  local_3f0 = tf::MPMC<int,_4UL>::capacity(&local_300);
  EVar2 = doctest::detail::ExpressionDecomposer::operator<<
                    ((ExpressionDecomposer *)in_stack_fffffffffffff188,(unsigned_long *)pRVar4);
  local_400 = EVar2.lhs;
  local_3f8 = EVar2.m_at;
  local_3e0 = local_400;
  local_3d8 = local_3f8;
  doctest::detail::Expression_lhs<const_unsigned_long>::operator==<unsigned_long,_nullptr>
            ((Expression_lhs<const_unsigned_long> *)
             CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
             (unsigned_long *)in_stack_fffffffffffff208);
  doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
  doctest::detail::Result::~Result((Result *)0x177e63);
  doctest::detail::ResultBuilder::log(&local_3b0,__x);
  if ((extraout_AL & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x177f7e);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff1a8,(Enum)(in_stack_fffffffffffff1a0 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
             in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
             (char *)in_stack_fffffffffffff1b8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4a4,DT_REQUIRE);
  local_4a5 = tf::MPMC<int,_4UL>::empty(in_stack_fffffffffffff1b8);
  local_4a0 = doctest::detail::ExpressionDecomposer::operator<<
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                         (bool *)in_stack_fffffffffffff188);
  local_4a6 = 1;
  doctest::detail::Expression_lhs<bool_const>::operator==
            ((Expression_lhs<const_bool> *)
             CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
             (bool *)in_stack_fffffffffffff208);
  doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
  doctest::detail::Result::~Result((Result *)0x17806a);
  doctest::detail::ResultBuilder::log(&local_478,__x_00);
  if ((extraout_AL_00 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x178155);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff1a8,(Enum)(in_stack_fffffffffffff1a0 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
             in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
             (char *)in_stack_fffffffffffff1b8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_554,DT_REQUIRE);
  local_55c = (_Optional_payload_base<int>)
              tf::MPMC<int,_4UL>::try_dequeue
                        ((MPMC<int,_4UL> *)
                         CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308));
  local_570 = doctest::detail::ExpressionDecomposer::operator<<
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                         (optional<int> *)
                         CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
  local_550 = local_570;
  doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<std::nullopt_t,_nullptr>
            ((Expression_lhs<const_std::optional<int>_> *)
             CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),in_stack_fffffffffffff208
            );
  doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
  doctest::detail::Result::~Result((Result *)0x17826c);
  doctest::detail::ResultBuilder::log(&local_520,__x_01);
  if ((extraout_AL_01 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x178357);
  for (local_578 = 0; EVar6 = (Enum)(in_stack_fffffffffffff1a0 >> 0x20), local_578 < local_308;
      local_578 = local_578 + 1) {
    pRVar4 = (Result *)0x1d33b6;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_fffffffffffff1a8,EVar6,
               (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
               in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
               (char *)in_stack_fffffffffffff1b8);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_61c,DT_REQUIRE);
    std::vector<int,_std::allocator<int>_>::operator[](&local_320,local_578);
    local_61d = tf::MPMC<int,_4UL>::try_enqueue
                          ((MPMC<int,_4UL> *)
                           CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308),
                           in_stack_fffffffffffff304);
    local_618 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)
                           CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                           (bool *)in_stack_fffffffffffff188);
    local_61e = 1;
    doctest::detail::Expression_lhs<bool_const>::operator==
              ((Expression_lhs<const_bool> *)
               CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
               (bool *)in_stack_fffffffffffff208);
    doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
    doctest::detail::Result::~Result((Result *)0x17847c);
    doctest::detail::ResultBuilder::log(&local_5f0,__x_02);
    if ((extraout_AL_02 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x178561);
  }
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff1a8,EVar6,
             (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
             in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
             (char *)in_stack_fffffffffffff1b8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_6c4,DT_REQUIRE);
  std::vector<int,_std::allocator<int>_>::operator[](&local_320,local_308);
  local_6c5 = tf::MPMC<int,_4UL>::try_enqueue
                        ((MPMC<int,_4UL> *)
                         CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308),
                         in_stack_fffffffffffff304);
  local_6c0 = doctest::detail::ExpressionDecomposer::operator<<
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                         (bool *)in_stack_fffffffffffff188);
  local_6c6 = 0;
  doctest::detail::Expression_lhs<bool_const>::operator==
            ((Expression_lhs<const_bool> *)
             CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
             (bool *)in_stack_fffffffffffff208);
  doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
  doctest::detail::Result::~Result((Result *)0x178691);
  doctest::detail::ResultBuilder::log(&local_698,__x_03);
  if ((extraout_AL_03 & 1) != 0) {
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
  doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x17876a);
  pRVar4 = (Result *)0x1d33b6;
  doctest::detail::ResultBuilder::ResultBuilder
            (in_stack_fffffffffffff1a8,(Enum)(in_stack_fffffffffffff1a0 >> 0x20),
             (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
             in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
             (char *)in_stack_fffffffffffff1b8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_76c,DT_REQUIRE);
  local_76d = tf::MPMC<int,_4UL>::empty(in_stack_fffffffffffff1b8);
  local_768 = doctest::detail::ExpressionDecomposer::operator<<
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                         (bool *)in_stack_fffffffffffff188);
  local_76e = 0;
  doctest::detail::Expression_lhs<bool_const>::operator==
            ((Expression_lhs<const_bool> *)
             CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
             (bool *)in_stack_fffffffffffff208);
  doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
  doctest::detail::Result::~Result((Result *)0x178856);
  doctest::detail::ResultBuilder::log(&local_740,__x_04);
  if ((extraout_AL_04 & 1) == 0) {
    doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x178941);
    for (local_778 = 0; EVar6 = (Enum)(in_stack_fffffffffffff1a0 >> 0x20), local_778 < local_308;
        local_778 = local_778 + 1) {
      pRVar4 = (Result *)0x1d33b6;
      doctest::detail::ResultBuilder::ResultBuilder
                (in_stack_fffffffffffff1a8,EVar6,
                 (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                 in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
                 (char *)in_stack_fffffffffffff1b8);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_824,DT_REQUIRE);
      local_82c = (_Optional_payload_base<int>)
                  tf::MPMC<int,_4UL>::try_dequeue
                            ((MPMC<int,_4UL> *)
                             CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308));
      EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                        ((ExpressionDecomposer *)
                         CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                         (optional<int> *)
                         CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
      local_840 = EVar3;
      local_820 = EVar3;
      std::vector<int,_std::allocator<int>_>::operator[](&local_320,local_778);
      doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<int,_nullptr>
                ((Expression_lhs<const_std::optional<int>_> *)
                 CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
                 (int *)in_stack_fffffffffffff208);
      doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
      doctest::detail::Result::~Result((Result *)0x178a8b);
      doctest::detail::ResultBuilder::log(&local_7f0,__x_05);
      if ((extraout_AL_05 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x178b70);
    }
    pRVar4 = (Result *)0x1d33b6;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_fffffffffffff1a8,EVar6,
               (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
               in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
               (char *)in_stack_fffffffffffff1b8);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_8e4,DT_REQUIRE);
    local_8e5 = tf::MPMC<int,_4UL>::empty(in_stack_fffffffffffff1b8);
    local_8e0 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)
                           CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                           (bool *)in_stack_fffffffffffff188);
    local_8e6 = 1;
    doctest::detail::Expression_lhs<bool_const>::operator==
              ((Expression_lhs<const_bool> *)
               CONCAT17(in_stack_fffffffffffff217,in_stack_fffffffffffff210),
               (bool *)in_stack_fffffffffffff208);
    doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
    doctest::detail::Result::~Result((Result *)0x178c89);
    doctest::detail::ResultBuilder::log(&local_8b8,__x_06);
    if ((extraout_AL_06 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    bVar7 = extraout_AL_06;
    doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x178d62);
    pRVar4 = (Result *)0x1d33b6;
    doctest::detail::ResultBuilder::ResultBuilder
              (in_stack_fffffffffffff1a8,(Enum)(in_stack_fffffffffffff1a0 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
               in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
               (char *)in_stack_fffffffffffff1b8);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_994,DT_REQUIRE);
    rhs = (_Optional_payload_base<int>)
          tf::MPMC<int,_4UL>::try_dequeue
                    ((MPMC<int,_4UL> *)CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308)
                    );
    local_99c = rhs;
    local_9b0 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)
                           CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                           (optional<int> *)
                           CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
    local_990 = local_9b0;
    doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<std::nullopt_t,_nullptr>
              ((Expression_lhs<const_std::optional<int>_> *)
               CONCAT17(bVar7,in_stack_fffffffffffff210),(nullopt_t *)rhs);
    doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
    doctest::detail::Result::~Result((Result *)0x178e73);
    doctest::detail::ResultBuilder::log(&local_960,__x_07);
    if ((extraout_AL_07 & 1) == 0) {
      doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x178f52);
      for (local_9b8 = 0; local_9b8 < local_308; local_9b8 = local_9b8 + 1) {
        std::vector<int,_std::allocator<int>_>::operator[](&local_320,local_9b8);
        tf::MPMC<int,_4UL>::enqueue(in_stack_fffffffffffff310,in_stack_fffffffffffff30c);
      }
      pRVar4 = (Result *)0x1d33b6;
      doctest::detail::ResultBuilder::ResultBuilder
                (in_stack_fffffffffffff1a8,(Enum)(in_stack_fffffffffffff1a0 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                 in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
                 (char *)in_stack_fffffffffffff1b8);
      doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_a5c,DT_REQUIRE);
      std::vector<int,_std::allocator<int>_>::operator[](&local_320,local_308);
      local_a5d = tf::MPMC<int,_4UL>::try_enqueue
                            ((MPMC<int,_4UL> *)
                             CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308),
                             in_stack_fffffffffffff304);
      local_a58 = doctest::detail::ExpressionDecomposer::operator<<
                            ((ExpressionDecomposer *)
                             CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                             (bool *)in_stack_fffffffffffff188);
      local_a5e = 0;
      doctest::detail::Expression_lhs<bool_const>::operator==
                ((Expression_lhs<const_bool> *)CONCAT17(bVar7,in_stack_fffffffffffff210),(bool *)rhs
                );
      doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
      doctest::detail::Result::~Result((Result *)0x1790b7);
      doctest::detail::ResultBuilder::log(&local_a30,__x_08);
      if ((extraout_AL_08 & 1) != 0) {
        pcVar1 = (code *)swi(3);
        (*pcVar1)();
        return;
      }
      doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
      doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x17918a);
      local_a68 = 0;
      while( true ) {
        EVar6 = (Enum)(in_stack_fffffffffffff1a0 >> 0x20);
        if (local_308 <= local_a68) {
          pRVar4 = (Result *)0x1d33b6;
          doctest::detail::ResultBuilder::ResultBuilder
                    (in_stack_fffffffffffff1a8,EVar6,
                     (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                     in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
                     (char *)in_stack_fffffffffffff1b8);
          doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_c7c,DT_REQUIRE);
          tf::MPMC<int,_4UL>::empty(in_stack_fffffffffffff1b8);
          exception_string =
               doctest::detail::ExpressionDecomposer::operator<<
                         ((ExpressionDecomposer *)
                          CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                          (bool *)in_stack_fffffffffffff188);
          local_c78 = exception_string;
          doctest::detail::Expression_lhs<bool_const>::operator==
                    ((Expression_lhs<const_bool> *)CONCAT17(bVar7,in_stack_fffffffffffff210),
                     (bool *)rhs);
          doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
          doctest::detail::Result::~Result((Result *)0x179673);
          doctest::detail::ResultBuilder::log(&local_c50,__x_11);
          if ((extraout_AL_11 & 1) != 0) {
            pcVar1 = (code *)swi(3);
            (*pcVar1)();
            return;
          }
          doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
          doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x179746);
          pRVar4 = (Result *)0x1d33b6;
          doctest::detail::ResultBuilder::ResultBuilder
                    (in_stack_fffffffffffff1a8,EVar6,
                     (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                     in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
                     (char *)exception_string);
          doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_d2c,DT_REQUIRE);
          tf::MPMC<int,_4UL>::try_dequeue
                    ((MPMC<int,_4UL> *)CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308)
                    );
          EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                            ((ExpressionDecomposer *)
                             CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                             (optional<int> *)
                             CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
          local_d28 = EVar3;
          doctest::detail::Expression_lhs<const_std::optional<int>_>::
          operator==<std::nullopt_t,_nullptr>
                    ((Expression_lhs<const_std::optional<int>_> *)
                     CONCAT17(bVar7,in_stack_fffffffffffff210),(nullopt_t *)rhs);
          doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
          doctest::detail::Result::~Result((Result *)0x17984b);
          doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffff308,__x_12);
          uVar5 = CONCAT13(extraout_AL_12,(int3)in_stack_fffffffffffff198);
          if ((extraout_AL_12 & 1) == 0) {
            doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
            doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x17992a);
            std::vector<int,_std::allocator<int>_>::~vector
                      ((vector<int,_std::allocator<int>_> *)CONCAT44(EVar3.m_at,uVar5));
            return;
          }
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        pRVar4 = (Result *)0x1d33b6;
        doctest::detail::ResultBuilder::ResultBuilder
                  (in_stack_fffffffffffff1a8,EVar6,
                   (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                   in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
                   (char *)in_stack_fffffffffffff1b8);
        doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_b0c,DT_REQUIRE);
        local_b0d = tf::MPMC<int,_4UL>::empty(in_stack_fffffffffffff1b8);
        local_b08 = doctest::detail::ExpressionDecomposer::operator<<
                              ((ExpressionDecomposer *)
                               CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190),
                               (bool *)in_stack_fffffffffffff188);
        local_b0e = 0;
        doctest::detail::Expression_lhs<bool_const>::operator==
                  ((Expression_lhs<const_bool> *)CONCAT17(bVar7,in_stack_fffffffffffff210),
                   (bool *)rhs);
        doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
        doctest::detail::Result::~Result((Result *)0x17928c);
        doctest::detail::ResultBuilder::log(&local_ae0,__x_09);
        if ((extraout_AL_09 & 1) != 0) {
          pcVar1 = (code *)swi(3);
          (*pcVar1)();
          return;
        }
        doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
        doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x179371);
        pRVar4 = (Result *)0x1d33b6;
        doctest::detail::ResultBuilder::ResultBuilder
                  (in_stack_fffffffffffff1a8,(Enum)(in_stack_fffffffffffff1a0 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                   in_stack_fffffffffffff194,(char *)in_stack_fffffffffffff188,"",
                   (char *)in_stack_fffffffffffff1b8);
        doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_bbc,DT_REQUIRE);
        local_bc4 = (_Optional_payload_base<int>)
                    tf::MPMC<int,_4UL>::try_dequeue
                              ((MPMC<int,_4UL> *)
                               CONCAT44(in_stack_fffffffffffff30c,in_stack_fffffffffffff308));
        EVar3 = doctest::detail::ExpressionDecomposer::operator<<
                          ((ExpressionDecomposer *)
                           CONCAT44(in_stack_fffffffffffff19c,in_stack_fffffffffffff198),
                           (optional<int> *)
                           CONCAT44(in_stack_fffffffffffff194,in_stack_fffffffffffff190));
        local_bd8 = EVar3;
        local_bb8 = EVar3;
        std::vector<int,_std::allocator<int>_>::operator[](&local_320,local_a68);
        doctest::detail::Expression_lhs<const_std::optional<int>_>::operator==<int,_nullptr>
                  ((Expression_lhs<const_std::optional<int>_> *)
                   CONCAT17(bVar7,in_stack_fffffffffffff210),(int *)rhs);
        doctest::detail::ResultBuilder::setResult(in_stack_fffffffffffff188,pRVar4);
        doctest::detail::Result::~Result((Result *)0x179487);
        doctest::detail::ResultBuilder::log(&local_b88,__x_10);
        if ((extraout_AL_10 & 1) != 0) break;
        doctest::detail::ResultBuilder::react(in_stack_fffffffffffff188);
        doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x179566);
        local_a68 = local_a68 + 1;
      }
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void mpmc_basics() {

  tf::MPMC<T, LogSize> mpmc;
  size_t N = (1<<LogSize);
  std::vector<T> data(N+1, -1);

  REQUIRE(mpmc.capacity() == N);

  REQUIRE(mpmc.empty() == true);
  REQUIRE(mpmc.try_dequeue() == std::nullopt);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_enqueue(data[i]) == true);
  }

  REQUIRE(mpmc.try_enqueue(data[N]) == false);
  REQUIRE(mpmc.empty() == false);

  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.try_dequeue() == data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == std::nullopt);

  for(size_t i=0; i<N; i++) {
    mpmc.enqueue(data[i]);
  }
  REQUIRE(mpmc.try_enqueue(data[N]) == false);
  
  for(size_t i=0; i<N; i++) {
    REQUIRE(mpmc.empty() == false);
    REQUIRE(mpmc.try_dequeue() == data[i]);
  }

  REQUIRE(mpmc.empty() == true); 
  REQUIRE(mpmc.try_dequeue() == std::nullopt);
}